

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  FP *pFVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  double dVar7;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  MassType mass;
  FactorType factor;
  ChargeType charge;
  PositionType position;
  AssertHelper local_100;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_e0;
  double local_d8;
  double local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  double local_98;
  double local_88;
  ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)3>_> *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 *local_48 [3];
  
  local_48[0] = &DAT_4008cccccccccccd;
  local_48[1] = (undefined1 *)0xc0400ccccccccccd;
  local_48[2] = (undefined1 *)0x3f068b5cbff47736;
  local_a8 = ZEXT816(0xc24aed46f4800000);
  local_98 = 1.23e-05;
  local_c0 = &DAT_3a520b016873bbd3;
  local_70 = &DAT_be0080f172b1f37d;
  local_78 = &DAT_4061800000000000;
  local_58 = 0x3f068b5cbff47736;
  local_68 = &DAT_4008cccccccccccd;
  uStack_60 = 0xc0400ccccccccccd;
  dVar3 = *pica::ParticleTypes::types * 29979245800.0;
  local_c8 = 1.23e-05 / dVar3;
  auVar2._8_4_ = SUB84(dVar3,0);
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
  local_b8 = divpd(local_a8,auVar2);
  local_88 = 1.0 / SQRT(local_c8 * local_c8 +
                        local_b8._0_8_ * local_b8._0_8_ + local_b8._8_8_ * local_b8._8_8_ + 1.0);
  lVar5 = 0;
  local_80 = this;
  do {
    local_d8 = (double)local_58;
    sStack_e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_60;
    local_e8 = (undefined1  [8])local_68;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_f8,"position[d]","particle.getPosition()[d]",
               (double *)((long)local_48 + lVar5),(double *)(local_e8 + lVar5));
    if (local_f8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_f0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x34,pcVar6);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (((local_e8 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
         && (local_e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  dVar3 = (double)local_b8._8_8_ * 29979245800.0;
  local_b8._8_4_ = SUB84(dVar3,0);
  local_b8._0_8_ = (double)local_b8._0_8_ * 29979245800.0;
  local_b8._12_4_ = (int)((ulong)dVar3 >> 0x20);
  local_c8 = local_c8 * 29979245800.0;
  lVar5 = 0;
  do {
    dVar3 = *pica::ParticleTypes::types;
    local_d8 = local_c8 * dVar3;
    unique0x100003f3 = SUB84(dVar3 * (double)local_b8._8_8_,0);
    local_e8 = (undefined1  [8])(dVar3 * (double)local_b8._0_8_);
    unique0x100003f7 = (int)((ulong)(dVar3 * (double)local_b8._8_8_) >> 0x20);
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_f8,"momentum[d]","particle.getMomentum()[d]",
               (double *)(local_a8 + lVar5),(double *)(local_e8 + lVar5));
    if (local_f8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_f0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x35,pcVar6);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (((local_e8 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
         && (local_e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  local_f8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       *pica::ParticleTypes::types;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"mass","particle.getMass()",(double *)&local_c0,
             (double *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (sStack_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)sStack_e0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x36,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (((local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (local_f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_f8.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_e8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_e8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_f8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pica::ParticleTypes::types[1];
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)local_e8,"charge","particle.getCharge()",(double *)&local_70,
               (double *)&local_f8);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (sStack_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)sStack_e0.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x37,pcVar6);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (((local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         (local_f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f8.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_e8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_e8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &DAT_4061800000000000;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)local_e8,"factor","particle.getFactor()",(double *)&local_78,
                 (double *)&local_f8);
      if (local_e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_f8);
        if (sStack_e0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)sStack_e0.ptr_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x38,pcVar6);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if (((local_f8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
           (local_f8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_f8.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_e8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_e8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        dVar7 = SQRT((local_98 * local_98 +
                     (double)local_a8._0_8_ * (double)local_a8._0_8_ +
                     (double)local_a8._8_8_ * (double)local_a8._8_8_) /
                     ((double)local_c0 * 29979245800.0 * (double)local_c0 * 29979245800.0) + 1.0);
        (local_80->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
        super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
        maxRelativeError = 1e-12;
        pFVar1 = &(local_80->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                  super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
                  maxAbsoluteError;
        dVar3 = dVar7 - 1.0 / local_88;
        if (ABS(dVar7) < *pFVar1 || ABS(dVar7) == *pFVar1) {
          local_f8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)ABS(dVar3)
          ;
          testing::internal::CmpHelperLE<double,double>
                    ((internal *)local_e8,"fabs(expectedGamma - particle.getGamma())",
                     "this->maxAbsoluteError",(double *)&local_f8,
                     &(local_80->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                      super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.
                      super_BaseFixture.maxAbsoluteError);
          if (local_e8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_f8);
            if (sStack_e0.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)sStack_e0.ptr_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                       ,0x3b,pcVar6);
            testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            if (((local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
                (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
               (local_f8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_f8.ptr_ + 8))();
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_e8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_e8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
        else {
          local_f8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ABS(dVar3 / dVar7);
          testing::internal::CmpHelperLE<double,double>
                    ((internal *)local_e8,
                     "fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
                     "this->maxRelativeError",(double *)&local_f8,
                     &(local_80->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                      super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.
                      super_BaseFixture.maxRelativeError);
          if (local_e8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_f8);
            if (sStack_e0.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)sStack_e0.ptr_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                       ,0x3b,pcVar6);
            testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            if (((local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
                (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
               (local_f8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_f8.ptr_ + 8))();
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_e8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_e8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Constructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(3.1, -32.1, 4.3e-5);
    MomentumType momentum(-231.3e9, 0.0, 1.23e-5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    FactorType factor = static_cast<FactorType>(1.4e2);

    ParticleType particle(position, momentum, factor, 0);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(factor, particle.getFactor());
    GammaType expectedGamma = sqrt((FP)1 + momentum.norm2() / sqr(mass * Constants<GammaType >::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}